

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::ArraySortMethod::~ArraySortMethod(ArraySortMethod *this)

{
  SystemSubroutine::~SystemSubroutine(&this->super_SystemSubroutine);
  operator_delete(this,0x40);
  return;
}

Assistant:

ArraySortMethod(KnownSystemName knownNameId, bool reversed) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), reversed(reversed) {
        withClauseMode = WithClauseMode::Iterator;
    }